

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Double_Window.cxx
# Opt level: O1

void __thiscall
Fl_Graphics_Driver::copy_offscreen
          (Fl_Graphics_Driver *this,int x,int y,int w,int h,Fl_Offscreen pixmap,int srcx,int srcy)

{
  Window WVar1;
  Fl_Surface_Device *pFVar2;
  Fl_Display_Device *pFVar3;
  uchar *puVar4;
  
  WVar1 = fl_window;
  pFVar2 = Fl_Surface_Device::_surface;
  fl_window = pixmap;
  if (Fl_Surface_Device::_surface == (Fl_Surface_Device *)0x0) {
    pFVar2 = Fl_Surface_Device::default_surface();
  }
  pFVar3 = Fl_Display_Device::display_device();
  (*(pFVar3->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[3])(pFVar3);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2d])();
  puVar4 = fl_read_image((uchar *)0x0,srcx,srcy,w,h,0);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  fl_window = WVar1;
  (*(pFVar2->super_Fl_Device)._vptr_Fl_Device[3])(pFVar2);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2f])
            (fl_graphics_driver,puVar4,(ulong)(uint)x,(ulong)(uint)y,(ulong)(uint)w,h,3,0);
  if (puVar4 != (uchar *)0x0) {
    operator_delete__(puVar4);
    return;
  }
  return;
}

Assistant:

void Fl_Graphics_Driver::copy_offscreen(int x, int y, int w, int h, Fl_Offscreen pixmap, int srcx, int srcy)
{
  fl_begin_offscreen(pixmap);
  uchar *img = fl_read_image(NULL, srcx, srcy, w, h, 0);
  fl_end_offscreen();
  fl_draw_image(img, x, y, w, h, 3, 0);
  delete[] img;
}